

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3InsertData(Fts3Table *p,sqlite3_value **apVal,sqlite3_int64 *piDocid)

{
  long lVar1;
  int iVar2;
  sqlite3_stmt *psVar3;
  sqlite3_value *in_RDX;
  sqlite3_stmt *in_RSI;
  Fts3Table *in_RDI;
  long in_FS_OFFSET;
  sqlite3_value *pRowid;
  int rc;
  sqlite3_stmt *pContentInsert;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  sqlite3_stmt *in_stack_ffffffffffffffc0;
  sqlite3_value *pVal;
  undefined4 in_stack_ffffffffffffffc8;
  int local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->zContentTbl == (char *)0x0) {
    local_14 = fts3SqlStmt(in_RDI,(int)((ulong)in_RSI >> 0x20),(sqlite3_stmt **)in_RDX,
                           (sqlite3_value **)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffc8));
    if ((local_14 == 0) && (in_RDI->zLanguageid != (char *)0x0)) {
      psVar3 = (sqlite3_stmt *)&DAT_aaaaaaaaaaaaaaaa;
      sqlite3_value_int((sqlite3_value *)0x254134);
      local_14 = sqlite3_bind_int(psVar3,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    }
    if (local_14 == 0) {
      iVar2 = sqlite3_value_type(*(sqlite3_value **)(in_RSI + (long)(in_RDI->nColumn + 3) * 8));
      if (iVar2 != 5) {
        iVar2 = sqlite3_value_type(*(sqlite3_value **)in_RSI);
        if ((iVar2 == 5) &&
           (iVar2 = sqlite3_value_type(*(sqlite3_value **)(in_RSI + 8)), iVar2 != 5)) {
          local_14 = 1;
          goto LAB_00254234;
        }
        local_14 = sqlite3_bind_value((sqlite3_stmt *)in_RDI,(int)((ulong)in_RSI >> 0x20),in_RDX);
        if (local_14 != 0) goto LAB_00254234;
      }
      sqlite3_step(in_RSI);
      local_14 = sqlite3_reset(in_stack_ffffffffffffffc0);
      psVar3 = (sqlite3_stmt *)sqlite3_last_insert_rowid(in_RDI->db);
      (in_RDX->u).i = (i64)psVar3;
    }
  }
  else {
    pVal = *(sqlite3_value **)(in_RSI + (long)(in_RDI->nColumn + 3) * 8);
    iVar2 = sqlite3_value_type(pVal);
    if (iVar2 == 5) {
      pVal = *(sqlite3_value **)(in_RSI + 8);
    }
    iVar2 = sqlite3_value_type(pVal);
    if (iVar2 == 1) {
      psVar3 = (sqlite3_stmt *)sqlite3_value_int64((sqlite3_value *)0x2540b3);
      (in_RDX->u).i = (i64)psVar3;
      local_14 = 0;
    }
    else {
      local_14 = 0x13;
    }
  }
LAB_00254234:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_14;
}

Assistant:

static int fts3InsertData(
  Fts3Table *p,                   /* Full-text table */
  sqlite3_value **apVal,          /* Array of values to insert */
  sqlite3_int64 *piDocid          /* OUT: Docid for row just inserted */
){
  int rc;                         /* Return code */
  sqlite3_stmt *pContentInsert;   /* INSERT INTO %_content VALUES(...) */

  if( p->zContentTbl ){
    sqlite3_value *pRowid = apVal[p->nColumn+3];
    if( sqlite3_value_type(pRowid)==SQLITE_NULL ){
      pRowid = apVal[1];
    }
    if( sqlite3_value_type(pRowid)!=SQLITE_INTEGER ){
      return SQLITE_CONSTRAINT;
    }
    *piDocid = sqlite3_value_int64(pRowid);
    return SQLITE_OK;
  }

  /* Locate the statement handle used to insert data into the %_content
  ** table. The SQL for this statement is:
  **
  **   INSERT INTO %_content VALUES(?, ?, ?, ...)
  **
  ** The statement features N '?' variables, where N is the number of user
  ** defined columns in the FTS3 table, plus one for the docid field.
  */
  rc = fts3SqlStmt(p, SQL_CONTENT_INSERT, &pContentInsert, &apVal[1]);
  if( rc==SQLITE_OK && p->zLanguageid ){
    rc = sqlite3_bind_int(
        pContentInsert, p->nColumn+2,
        sqlite3_value_int(apVal[p->nColumn+4])
    );
  }
  if( rc!=SQLITE_OK ) return rc;

  /* There is a quirk here. The users INSERT statement may have specified
  ** a value for the "rowid" field, for the "docid" field, or for both.
  ** Which is a problem, since "rowid" and "docid" are aliases for the
  ** same value. For example:
  **
  **   INSERT INTO fts3tbl(rowid, docid) VALUES(1, 2);
  **
  ** In FTS3, this is an error. It is an error to specify non-NULL values
  ** for both docid and some other rowid alias.
  */
  if( SQLITE_NULL!=sqlite3_value_type(apVal[3+p->nColumn]) ){
    if( SQLITE_NULL==sqlite3_value_type(apVal[0])
     && SQLITE_NULL!=sqlite3_value_type(apVal[1])
    ){
      /* A rowid/docid conflict. */
      return SQLITE_ERROR;
    }
    rc = sqlite3_bind_value(pContentInsert, 1, apVal[3+p->nColumn]);
    if( rc!=SQLITE_OK ) return rc;
  }

  /* Execute the statement to insert the record. Set *piDocid to the
  ** new docid value.
  */
  sqlite3_step(pContentInsert);
  rc = sqlite3_reset(pContentInsert);

  *piDocid = sqlite3_last_insert_rowid(p->db);
  return rc;
}